

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

qsizetype __thiscall QRegularExpressionMatch::capturedLength(QRegularExpressionMatch *this,int nth)

{
  QRegularExpressionMatchPrivate *pQVar1;
  longlong *plVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  lVar3 = -1;
  if (nth < 0) {
    lVar4 = -1;
  }
  else {
    pQVar1 = (this->d).d.ptr;
    lVar4 = -1;
    if (nth < pQVar1->capturedCount) {
      uVar5 = (ulong)(uint)(nth * 2);
      plVar2 = (pQVar1->capturedOffsets).d.ptr;
      if (plVar2[uVar5] == -1) {
        lVar3 = -1;
      }
      else {
        lVar3 = plVar2[uVar5 + 1];
      }
      lVar4 = (pQVar1->capturedOffsets).d.ptr[uVar5];
    }
  }
  return lVar3 - lVar4;
}

Assistant:

qsizetype QRegularExpressionMatch::capturedLength(int nth) const
{
    // bound checking performed by these two functions
    return capturedEnd(nth) - capturedStart(nth);
}